

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingScanPartial<int,int,unsigned_int>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  int *dst;
  BitpackingMode BVar1;
  byte width;
  int iVar2;
  data_ptr_t pdVar3;
  BitpackingScanState<int,_int> *this;
  idx_t iVar4;
  long lVar5;
  idx_t remaining;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong size;
  
  this = (BitpackingScanState<int,_int> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar7 = 0;
  do {
    uVar6 = scan_count - uVar7;
    if (scan_count < uVar7 || uVar6 == 0) {
      return;
    }
    iVar4 = this->current_group_offset;
    if (iVar4 == 0x800) {
      BitpackingScanState<int,_int>::LoadNextGroup(this);
      iVar4 = this->current_group_offset;
    }
    BVar1 = (this->current_group).mode;
    if (BVar1 == CONSTANT_DELTA) {
      size = 0x800 - iVar4;
      if (uVar6 < 0x800 - iVar4) {
        size = uVar6;
      }
      for (uVar6 = 0; size != uVar6; uVar6 = uVar6 + 1) {
        *(uint *)(pdVar3 + uVar6 * 4 + uVar7 * 4 + result_offset * 4) =
             ((uint)iVar4 + (int)uVar6) * this->current_constant + this->current_frame_of_reference;
      }
LAB_014eca35:
      iVar4 = iVar4 + size;
    }
    else {
      if (BVar1 == CONSTANT) {
        iVar2 = this->current_constant;
        for (lVar5 = uVar7 * 4; scan_count * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
          *(int *)(pdVar3 + lVar5 + result_offset * 4) = iVar2;
        }
        size = 0x800 - iVar4;
        if (uVar6 < 0x800 - iVar4) {
          size = uVar6;
        }
        goto LAB_014eca35;
      }
      uVar8 = (uint)iVar4 & 0x1f;
      size = 0x20 - (ulong)uVar8;
      if (uVar6 < size) {
        size = uVar6;
      }
      width = this->current_width;
      dst = (int *)(pdVar3 + uVar7 * 4 + result_offset * 4);
      if (size == 0x20) {
        BitpackingPrimitives::UnPackGroup<int>
                  ((data_ptr_t)dst,
                   this->current_group_ptr + ((width * iVar4 >> 3) - (ulong)(width * uVar8 >> 3)),
                   width,true);
      }
      else {
        BitpackingPrimitives::UnPackGroup<int>
                  ((data_ptr_t)this->decompression_buffer,
                   this->current_group_ptr + ((width * iVar4 >> 3) - (ulong)(width * uVar8 >> 3)),
                   width,true);
        switchD_0193dc74::default(dst,this->decompression_buffer + uVar8,size * 4);
      }
      BVar1 = (this->current_group).mode;
      ApplyFrameOfReference<int>(dst,this->current_frame_of_reference,size);
      if (BVar1 == DELTA_FOR) {
        DeltaDecode<int>(dst,this->current_delta_offset,size);
        this->current_delta_offset = dst[size - 1];
      }
      iVar4 = this->current_group_offset + size;
    }
    this->current_group_offset = iVar4;
    uVar7 = uVar7 + size;
  } while( true );
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}